

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt__tesselate_curve
              (stbtt__point *points,int *num_points,float x0,float y0,float x1,float y1,float x2,
              float y2,float objspace_flatness_squared,int n)

{
  int in_EAX;
  int n_00;
  float fVar1;
  float x2_00;
  float fVar2;
  float y2_00;
  
  if (n < 0x11) {
    fVar1 = x1 + x1 + x0;
    fVar2 = y1 + y1 + y0;
    n_00 = n + 1;
    do {
      x2_00 = (fVar1 + x2) * 0.25;
      y2_00 = (fVar2 + y2) * 0.25;
      fVar1 = (y0 + y2) * 0.5 - y2_00;
      fVar2 = (x0 + x2) * 0.5 - x2_00;
      if (fVar2 * fVar2 + fVar1 * fVar1 <= objspace_flatness_squared) {
        if (points != (stbtt__point *)0x0) {
          in_EAX = *num_points;
          points[in_EAX].x = x2;
          points[in_EAX].y = y2;
        }
        *num_points = *num_points + 1;
        return in_EAX;
      }
      in_EAX = stbtt__tesselate_curve
                         (points,num_points,x0,y0,(x0 + x1) * 0.5,(y1 + y0) * 0.5,x2_00,y2_00,
                          objspace_flatness_squared,n_00);
      x1 = (x1 + x2) * 0.5;
      y1 = (y1 + y2) * 0.5;
      fVar1 = x1 + x1 + x2_00;
      fVar2 = y1 + y1 + y2_00;
      n_00 = n_00 + 1;
      x0 = x2_00;
      y0 = y2_00;
    } while (n_00 != 0x12);
  }
  return in_EAX;
}

Assistant:

static int stbtt__tesselate_curve(stbtt__point *points, int *num_points, float x0, float y0, float x1, float y1, float x2, float y2, float objspace_flatness_squared, int n)
{
   // midpoint
   float mx = (x0 + 2*x1 + x2)/4;
   float my = (y0 + 2*y1 + y2)/4;
   // versus directly drawn line
   float dx = (x0+x2)/2 - mx;
   float dy = (y0+y2)/2 - my;
   if (n > 16) // 65536 segments on one curve better be enough!
      return 1;
   if (dx*dx+dy*dy > objspace_flatness_squared) { // half-pixel error allowed... need to be smaller if AA
      stbtt__tesselate_curve(points, num_points, x0,y0, (x0+x1)/2.0f,(y0+y1)/2.0f, mx,my, objspace_flatness_squared,n+1);
      stbtt__tesselate_curve(points, num_points, mx,my, (x1+x2)/2.0f,(y1+y2)/2.0f, x2,y2, objspace_flatness_squared,n+1);
   } else {
      stbtt__add_point(points, *num_points,x2,y2);
      *num_points = *num_points+1;
   }
   return 1;
}